

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

__m256 * __thiscall Plane::intersect(Plane *this,Ray8 *ray,DiffGeom8 *dg)

{
  uint uVar1;
  float fVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  __m256 *in_RAX;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  float fVar29;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 in_ZMM10 [64];
  undefined1 auVar30 [64];
  int iVar2;
  undefined1 auVar16 [32];
  
  uVar14._0_4_ = (this->pos).x;
  uVar14._4_4_ = (this->pos).y;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar14;
  auVar21 = *(undefined1 (*) [32])(ray->o).x;
  uVar6._0_4_ = (this->normal).x;
  uVar6._4_4_ = (this->normal).y;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar6;
  auVar4 = *(undefined1 (*) [32])(ray->o).y;
  fVar3 = (this->pos).z;
  auVar28._4_4_ = fVar3;
  auVar28._0_4_ = fVar3;
  auVar28._8_4_ = fVar3;
  auVar28._12_4_ = fVar3;
  auVar28._16_4_ = fVar3;
  auVar28._20_4_ = fVar3;
  auVar28._24_4_ = fVar3;
  auVar28._28_4_ = fVar3;
  auVar5 = *(undefined1 (*) [32])(ray->o).z;
  fVar3 = (this->normal).z;
  auVar19._4_4_ = fVar3;
  auVar19._0_4_ = fVar3;
  auVar19._8_4_ = fVar3;
  auVar19._12_4_ = fVar3;
  auVar19._16_4_ = fVar3;
  auVar19._20_4_ = fVar3;
  auVar19._24_4_ = fVar3;
  auVar19._28_4_ = fVar3;
  fVar3 = (ray->d).x[0];
  fVar7 = (ray->d).x[1];
  fVar8 = (ray->d).x[2];
  fVar9 = (ray->d).x[3];
  fVar10 = (ray->d).x[4];
  fVar11 = (ray->d).x[5];
  fVar12 = (ray->d).x[6];
  fVar13 = (ray->d).x[7];
  auVar27._4_4_ = (undefined4)uVar14;
  auVar27._0_4_ = (undefined4)uVar14;
  auVar27._8_4_ = (undefined4)uVar14;
  auVar27._12_4_ = (undefined4)uVar14;
  auVar27._16_4_ = (undefined4)uVar14;
  auVar27._20_4_ = (undefined4)uVar14;
  auVar27._24_4_ = (undefined4)uVar14;
  auVar27._28_4_ = (undefined4)uVar14;
  auVar17 = vmovshdup_avx(auVar17);
  auVar20._4_4_ = (undefined4)uVar6;
  auVar20._0_4_ = (undefined4)uVar6;
  auVar20._8_4_ = (undefined4)uVar6;
  auVar20._12_4_ = (undefined4)uVar6;
  auVar20._16_4_ = (undefined4)uVar6;
  auVar20._20_4_ = (undefined4)uVar6;
  auVar20._24_4_ = (undefined4)uVar6;
  auVar20._28_4_ = (undefined4)uVar6;
  auVar22 = vshufps_avx(auVar22,auVar22,0xf5);
  auVar18._0_8_ = auVar17._0_8_;
  auVar18._8_8_ = auVar18._0_8_;
  auVar18._16_8_ = auVar18._0_8_;
  auVar18._24_8_ = auVar18._0_8_;
  auVar23._0_8_ = auVar22._0_8_;
  auVar23._8_8_ = auVar23._0_8_;
  auVar23._16_8_ = auVar23._0_8_;
  auVar23._24_8_ = auVar23._0_8_;
  auVar28 = vsubps_avx(auVar28,auVar5);
  auVar27 = vsubps_avx(auVar27,auVar21);
  auVar18 = vsubps_avx(auVar18,auVar4);
  auVar30._0_4_ = auVar27._0_4_ * (float)(undefined4)uVar6;
  auVar30._4_4_ = auVar27._4_4_ * (float)(undefined4)uVar6;
  auVar30._8_4_ = auVar27._8_4_ * (float)(undefined4)uVar6;
  auVar30._12_4_ = auVar27._12_4_ * (float)(undefined4)uVar6;
  auVar30._16_4_ = auVar27._16_4_ * (float)(undefined4)uVar6;
  auVar30._20_4_ = auVar27._20_4_ * (float)(undefined4)uVar6;
  auVar30._28_36_ = in_ZMM10._28_36_;
  auVar30._24_4_ = auVar27._24_4_ * (float)(undefined4)uVar6;
  auVar27 = *(undefined1 (*) [32])(ray->d).y;
  auVar17 = vfmadd231ps_fma(auVar30._0_32_,auVar23,auVar18);
  auVar15._4_4_ = (float)(undefined4)uVar6 * fVar7;
  auVar15._0_4_ = (float)(undefined4)uVar6 * fVar3;
  auVar15._8_4_ = (float)(undefined4)uVar6 * fVar8;
  auVar15._12_4_ = (float)(undefined4)uVar6 * fVar9;
  auVar15._16_4_ = (float)(undefined4)uVar6 * fVar10;
  auVar15._20_4_ = (float)(undefined4)uVar6 * fVar11;
  auVar15._24_4_ = (float)(undefined4)uVar6 * fVar12;
  auVar15._28_4_ = auVar18._28_4_;
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar19,auVar28);
  auVar28 = *(undefined1 (*) [32])(ray->d).z;
  auVar22 = vfmadd231ps_fma(auVar15,auVar27,auVar23);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar28,auVar19);
  auVar18 = vdivps_avx(ZEXT1632(auVar17),ZEXT1632(auVar22));
  uVar14 = vcmpps_avx512vl(auVar18,*(undefined1 (*) [32])ray->t_max,1);
  uVar6 = vcmpps_avx512vl(auVar18,*(undefined1 (*) [32])ray->t_min,0xe);
  uVar14 = uVar14 & uVar6;
  auVar15 = vmovdqa32_avx512vl(*(undefined1 (*) [32])ray->active);
  auVar16._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar15._4_4_;
  auVar16._0_4_ = (uint)((byte)uVar14 & 1) * auVar15._0_4_;
  auVar16._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar15._8_4_;
  auVar16._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar15._12_4_;
  auVar16._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar15._16_4_;
  uVar1 = (uint)((byte)(uVar14 >> 5) & 1) * auVar15._20_4_;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar15._24_4_;
  iVar2 = (uint)(byte)(uVar14 >> 7) * auVar15._28_4_;
  auVar16._28_4_ = iVar2;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') || (uVar1 & 1) != 0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || iVar2 < 0) {
    auVar18 = vblendvps_avx(*(undefined1 (*) [32])ray->t_max,auVar18,auVar16);
    fVar29 = auVar18._0_4_;
    fVar31 = auVar18._4_4_;
    fVar32 = auVar18._8_4_;
    fVar33 = auVar18._12_4_;
    fVar34 = auVar18._16_4_;
    fVar35 = auVar18._20_4_;
    fVar36 = auVar18._24_4_;
    *(undefined1 (*) [32])ray->t_max = auVar18;
    auVar24._0_4_ = auVar21._0_4_ + fVar29 * fVar3;
    auVar24._4_4_ = auVar21._4_4_ + fVar31 * fVar7;
    auVar24._8_4_ = auVar21._8_4_ + fVar32 * fVar8;
    auVar24._12_4_ = auVar21._12_4_ + fVar33 * fVar9;
    auVar24._16_4_ = auVar21._16_4_ + fVar34 * fVar10;
    auVar24._20_4_ = auVar21._20_4_ + fVar35 * fVar11;
    auVar24._24_4_ = auVar21._24_4_ + fVar36 * fVar12;
    auVar24._28_4_ = auVar21._28_4_ + fVar13;
    auVar25._0_4_ = fVar29 * auVar27._0_4_ + auVar4._0_4_;
    auVar25._4_4_ = fVar31 * auVar27._4_4_ + auVar4._4_4_;
    auVar25._8_4_ = fVar32 * auVar27._8_4_ + auVar4._8_4_;
    auVar25._12_4_ = fVar33 * auVar27._12_4_ + auVar4._12_4_;
    auVar25._16_4_ = fVar34 * auVar27._16_4_ + auVar4._16_4_;
    auVar25._20_4_ = fVar35 * auVar27._20_4_ + auVar4._20_4_;
    auVar25._24_4_ = fVar36 * auVar27._24_4_ + auVar4._24_4_;
    auVar25._28_4_ = auVar27._28_4_ + auVar4._28_4_;
    auVar26._0_4_ = fVar29 * auVar28._0_4_ + auVar5._0_4_;
    auVar26._4_4_ = fVar31 * auVar28._4_4_ + auVar5._4_4_;
    auVar26._8_4_ = fVar32 * auVar28._8_4_ + auVar5._8_4_;
    auVar26._12_4_ = fVar33 * auVar28._12_4_ + auVar5._12_4_;
    auVar26._16_4_ = fVar34 * auVar28._16_4_ + auVar5._16_4_;
    auVar26._20_4_ = fVar35 * auVar28._20_4_ + auVar5._20_4_;
    auVar26._24_4_ = fVar36 * auVar28._24_4_ + auVar5._24_4_;
    auVar26._28_4_ = auVar28._28_4_ + auVar5._28_4_;
    auVar21 = vblendvps_avx(*(undefined1 (*) [32])(dg->normal).x,auVar20,auVar16);
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(dg->point).x,auVar24,auVar16);
    *(undefined1 (*) [32])(dg->point).x = auVar4;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(dg->point).y,auVar25,auVar16);
    *(undefined1 (*) [32])(dg->point).y = auVar4;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(dg->point).z,auVar26,auVar16);
    *(undefined1 (*) [32])(dg->point).z = auVar4;
    *(undefined1 (*) [32])(dg->normal).x = auVar21;
    auVar21 = vblendvps_avx(*(undefined1 (*) [32])(dg->normal).y,auVar23,auVar16);
    *(undefined1 (*) [32])(dg->normal).y = auVar21;
    auVar21 = vblendvps_avx(*(undefined1 (*) [32])(dg->normal).z,auVar19,auVar16);
    *(undefined1 (*) [32])(dg->normal).z = auVar21;
    iVar2 = this->material_id;
    auVar21._4_4_ = iVar2;
    auVar21._0_4_ = iVar2;
    auVar21._8_4_ = iVar2;
    auVar21._12_4_ = iVar2;
    auVar21._16_4_ = iVar2;
    auVar21._20_4_ = iVar2;
    auVar21._24_4_ = iVar2;
    auVar21._28_4_ = iVar2;
    auVar21 = vblendvps_avx(*(undefined1 (*) [32])dg->material_id,auVar21,auVar16);
    *(undefined1 (*) [32])dg->material_id = auVar21;
  }
  return in_RAX;
}

Assistant:

inline Vec3f_8(Vec3f v)
		: x(_mm256_set1_ps(v.x)), y(_mm256_set1_ps(v.y)), z(_mm256_set1_ps(v.z)){}